

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5VocabInitVtab(sqlite3 *db,void *pAux,int argc,char **argv,sqlite3_vtab **ppVTab,char **pzErr
                     )

{
  byte bVar1;
  int *__s;
  char *__s_00;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  byte *z;
  sqlite3_vtab *psVar6;
  char *pcVar7;
  long lVar8;
  int iVar9;
  void *__dest;
  long in_FS_OFFSET;
  bool bVar10;
  char *azSchema [3];
  int local_5c;
  char *local_58 [4];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58[0] = "CREATE TABlE vocab(term, col, doc, cnt)";
  local_58[1] = "CREATE TABlE vocab(term, doc, cnt)";
  local_58[2] = "CREATE TABlE vocab(term, doc, col, offset)";
  if (argc == 6) {
    __s = (int *)argv[1];
    sVar3 = strlen((char *)__s);
    if (sVar3 != 4) goto LAB_001f4a94;
    bVar10 = *__s == 0x706d6574;
  }
  else {
LAB_001f4a94:
    bVar10 = false;
  }
  if ((argc != 5) && (bVar10 == false)) {
    psVar6 = (sqlite3_vtab *)0x0;
    pcVar4 = sqlite3_mprintf("wrong number of vtable arguments");
    *pzErr = pcVar4;
    local_5c = 1;
    goto LAB_001f4cd0;
  }
  pcVar4 = argv[(ulong)bVar10 + 3];
  pcVar7 = argv[(ulong)bVar10 + 4];
  __s_00 = argv[(ulong)bVar10 * 2 + 1];
  sVar3 = strlen(__s_00);
  sVar5 = strlen(pcVar4);
  local_5c = 0;
  z = (byte *)sqlite3Fts5Strndup(&local_5c,pcVar7,-1);
  if (local_5c == 0) {
    if ((*z - 0x22 < 0x3f) && ((0x4200000000000021U >> ((ulong)(*z - 0x22) & 0x3f) & 1) != 0)) {
      fts5Dequote((char *)z);
    }
    lVar8 = 0;
    do {
      bVar1 = z[lVar8];
      if (bVar1 == "ncol"[lVar8 + 1]) {
        if ((ulong)bVar1 == 0) goto LAB_001f4b86;
      }
      else if (""[bVar1] != ""[(byte)"ncol"[lVar8 + 1]]) {
        lVar8 = 0;
        goto LAB_001f4b94;
      }
      lVar8 = lVar8 + 1;
    } while( true );
  }
  iVar9 = 0;
  goto LAB_001f4c15;
LAB_001f4b94:
  bVar1 = z[lVar8];
  if (bVar1 == "Unable to fetch row"[lVar8 + 0x10]) {
    if ((ulong)bVar1 == 0) goto LAB_001f4bb8;
  }
  else if (""[bVar1] != ""[(byte)"Unable to fetch row"[lVar8 + 0x10]]) {
    lVar8 = 0;
    goto LAB_001f4bc9;
  }
  lVar8 = lVar8 + 1;
  goto LAB_001f4b94;
LAB_001f4bc9:
  bVar1 = z[lVar8];
  if (bVar1 == "instance"[lVar8]) {
    if ((ulong)bVar1 == 0) goto LAB_001f4bf1;
  }
  else if (""[bVar1] != ""[(byte)"instance"[lVar8]]) {
    iVar9 = 0;
    pcVar7 = sqlite3_mprintf("fts5vocab: unknown table type: %Q",z);
    *pzErr = pcVar7;
    sqlite3_free(z);
    local_5c = 1;
    goto LAB_001f4c15;
  }
  lVar8 = lVar8 + 1;
  goto LAB_001f4bc9;
LAB_001f4bf1:
  lVar8 = 2;
  goto LAB_001f4bf7;
LAB_001f4bb8:
  lVar8 = 1;
  goto LAB_001f4bf7;
LAB_001f4b86:
  lVar8 = 0;
LAB_001f4bf7:
  sqlite3_free(z);
  iVar9 = (int)lVar8;
  local_5c = sqlite3_declare_vtab(db,local_58[lVar8]);
LAB_001f4c15:
  psVar6 = (sqlite3_vtab *)sqlite3Fts5MallocZero(&local_5c,(long)((int)sVar3 + (int)sVar5 + 0x42));
  if (psVar6 == (sqlite3_vtab *)0x0) {
    psVar6 = (sqlite3_vtab *)0x0;
  }
  else {
    sVar5 = (size_t)((int)sVar5 + 1);
    psVar6[2].pModule = (sqlite3_module *)pAux;
    psVar6[2].nRef = iVar9;
    psVar6[1].zErrMsg = (char *)db;
    psVar6[1].pModule = (sqlite3_module *)&psVar6[2].zErrMsg;
    __dest = (void *)((long)&psVar6[2].zErrMsg + sVar5);
    *(void **)&psVar6[1].nRef = __dest;
    memcpy(&psVar6[2].zErrMsg,pcVar4,sVar5);
    memcpy(__dest,__s_00,(long)((int)sVar3 + 1));
    uVar2 = (byte)(psVar6[1].pModule)->iVersion - 0x22;
    if ((uVar2 < 0x3f) && ((0x4200000000000021U >> ((ulong)uVar2 & 0x3f) & 1) != 0)) {
      fts5Dequote((char *)psVar6[1].pModule);
    }
    uVar2 = **(byte **)&psVar6[1].nRef - 0x22;
    if ((uVar2 < 0x3f) && ((0x4200000000000021U >> ((ulong)uVar2 & 0x3f) & 1) != 0)) {
      fts5Dequote((char *)*(byte **)&psVar6[1].nRef);
    }
  }
LAB_001f4cd0:
  *ppVTab = psVar6;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return local_5c;
  }
  __stack_chk_fail();
}

Assistant:

static int fts5VocabInitVtab(
  sqlite3 *db,                    /* The SQLite database connection */
  void *pAux,                     /* Pointer to Fts5Global object */
  int argc,                       /* Number of elements in argv array */
  const char * const *argv,       /* xCreate/xConnect argument array */
  sqlite3_vtab **ppVTab,          /* Write the resulting vtab structure here */
  char **pzErr                    /* Write any error message here */
){
  const char *azSchema[] = {
    "CREATE TABlE vocab(" FTS5_VOCAB_COL_SCHEMA  ")",
    "CREATE TABlE vocab(" FTS5_VOCAB_ROW_SCHEMA  ")",
    "CREATE TABlE vocab(" FTS5_VOCAB_INST_SCHEMA ")"
  };

  Fts5VocabTable *pRet = 0;
  int rc = SQLITE_OK;             /* Return code */
  int bDb;

  bDb = (argc==6 && strlen(argv[1])==4 && memcmp("temp", argv[1], 4)==0);

  if( argc!=5 && bDb==0 ){
    *pzErr = sqlite3_mprintf("wrong number of vtable arguments");
    rc = SQLITE_ERROR;
  }else{
    int nByte;                      /* Bytes of space to allocate */
    const char *zDb = bDb ? argv[3] : argv[1];
    const char *zTab = bDb ? argv[4] : argv[3];
    const char *zType = bDb ? argv[5] : argv[4];
    int nDb = (int)strlen(zDb)+1;
    int nTab = (int)strlen(zTab)+1;
    int eType = 0;

    rc = fts5VocabTableType(zType, pzErr, &eType);
    if( rc==SQLITE_OK ){
      assert( eType>=0 && eType<ArraySize(azSchema) );
      rc = sqlite3_declare_vtab(db, azSchema[eType]);
    }

    nByte = sizeof(Fts5VocabTable) + nDb + nTab;
    pRet = sqlite3Fts5MallocZero(&rc, nByte);
    if( pRet ){
      pRet->pGlobal = (Fts5Global*)pAux;
      pRet->eType = eType;
      pRet->db = db;
      pRet->zFts5Tbl = (char*)&pRet[1];
      pRet->zFts5Db = &pRet->zFts5Tbl[nTab];
      memcpy(pRet->zFts5Tbl, zTab, nTab);
      memcpy(pRet->zFts5Db, zDb, nDb);
      sqlite3Fts5Dequote(pRet->zFts5Tbl);
      sqlite3Fts5Dequote(pRet->zFts5Db);
    }
  }

  *ppVTab = (sqlite3_vtab*)pRet;
  return rc;
}